

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O1

void __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::
generic_set_entry_rela<ELFIO::Elf32_Rela>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr offset,Elf_Word symbol,uint type,Elf_Sxword addend)

{
  elfio *peVar1;
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  long lVar6;
  
  peVar1 = this->elf_file;
  iVar3 = (*this->relocation_section->_vptr_section[0x18])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->relocation_section->_vptr_section[0xf])();
  _Var2._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (elf_header *)0x0) {
    iVar4 = (*(_Var2._M_head_impl)->_vptr_elf_header[4])();
    if ((char)iVar4 == '\x01') {
      type = type & 0xff | symbol << 8;
    }
  }
  lVar8 = CONCAT44(extraout_var_00,iVar3) * index;
  *(uint *)(lVar6 + 4 + lVar8) = type;
  uVar9 = (uint)offset;
  *(uint *)(lVar6 + lVar8) = uVar9;
  uVar7 = (uint)addend;
  *(uint *)(lVar6 + 8 + lVar8) = uVar7;
  bVar10 = (peVar1->convertor).need_conversion == false;
  uVar5 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  if (bVar10) {
    uVar5 = uVar9;
  }
  *(uint *)(lVar6 + lVar8) = uVar5;
  uVar5 = type >> 0x18 | (type & 0xff0000) >> 8 | (type & 0xff00) << 8 | type << 0x18;
  if (bVar10) {
    uVar5 = type;
  }
  *(uint *)(lVar6 + 4 + lVar8) = uVar5;
  uVar5 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  if (bVar10) {
    uVar5 = uVar7;
  }
  *(uint *)(lVar6 + 8 + lVar8) = uVar5;
  return;
}

Assistant:

void generic_set_entry_rela( Elf_Xword  index,
                                 Elf64_Addr offset,
                                 Elf_Word   symbol,
                                 unsigned   type,
                                 Elf_Sxword addend )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        T* pEntry = const_cast<T*>( reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() ) );

        if ( elf_file.get_class() == ELFCLASS32 ) {
            pEntry->r_info = ELF32_R_INFO( (Elf_Xword)symbol, type );
        }
        else {
            pEntry->r_info = ELF64_R_INFO( (Elf_Xword)symbol, type );
        }
        pEntry->r_offset = decltype( pEntry->r_offset )( offset );
        pEntry->r_addend = decltype( pEntry->r_addend )( addend );
        pEntry->r_offset = convertor( pEntry->r_offset );
        pEntry->r_info   = convertor( pEntry->r_info );
        pEntry->r_addend = convertor( pEntry->r_addend );
    }